

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<int,unsigned_short>
          (BaseAppender *this,Vector *col,int input)

{
  bool bVar1;
  undefined1 auVar2 [12];
  unsigned_short result;
  uint16_t local_3a;
  string local_38;
  
  bVar1 = TryCast::Operation<int,unsigned_short>(input,&local_3a,false);
  if (bVar1) {
    *(uint16_t *)(col->data + (this->chunk).count * 2) = local_3a;
    return;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<int,unsigned_short>(&local_38,(duckdb *)(ulong)(uint)input,auVar2._8_4_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}